

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_argb.cc
# Opt level: O2

int ARGBCopy(uint8_t *src_argb,int src_stride_argb,uint8_t *dst_argb,int dst_stride_argb,int width,
            int height)

{
  int height_00;
  
  if ((height == 0 || width < 1) || (dst_argb == (uint8_t *)0x0 || src_argb == (uint8_t *)0x0)) {
    return -1;
  }
  height_00 = height;
  if (height < 0) {
    height_00 = -height;
    src_argb = src_argb + ~height * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }
  CopyPlane(src_argb,src_stride_argb,dst_argb,dst_stride_argb,width << 2,height_00);
  return 0;
}

Assistant:

LIBYUV_API
int ARGBCopy(const uint8_t* src_argb,
             int src_stride_argb,
             uint8_t* dst_argb,
             int dst_stride_argb,
             int width,
             int height) {
  if (!src_argb || !dst_argb || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src_argb = src_argb + (height - 1) * src_stride_argb;
    src_stride_argb = -src_stride_argb;
  }

  CopyPlane(src_argb, src_stride_argb, dst_argb, dst_stride_argb, width * 4,
            height);
  return 0;
}